

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

void __thiscall Triangle::draw(Triangle *this)

{
  Triangle *this_local;
  
  (*glad_glDisable)(0xb50);
  (*glad_glEnable)(0xb71);
  (*glad_glDepthFunc)(0x201);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glPushMatrix)();
  (*glad_glScalef)(this->scale,this->scale,1.0);
  (*glad_glRotatef)(this->rotationY,0.0,1.0,0.0);
  (*glad_glRotatef)(this->rotationX,1.0,0.0,0.0);
  _drawList(this);
  (*glad_glDisable)(0xbe2);
  (*glad_glPopMatrix)();
  return;
}

Assistant:

void Triangle::draw() {
    // Set OpenGL draw settings
    glDisable(GL_LIGHTING);
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LESS);
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

    glPushMatrix();

    // Perform scaling and rotation
    glScalef(scale, scale, 1.0);
    glRotatef(rotationY, 0.0f, 1.0f, 0.0f);
    glRotatef(rotationX, 1.0f, 0.0f, 0.0f);

    _drawList();

    // Unset OpenGL draw settings
    glDisable(GL_BLEND);

    glPopMatrix();
}